

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

long mi_option_get_clamp(mi_option_t option,long min,long max)

{
  long in_RDX;
  long in_RSI;
  long x;
  mi_option_t in_stack_ffffffffffffffcc;
  long local_30;
  long local_28;
  
  local_30 = mi_option_get(in_stack_ffffffffffffffcc);
  local_28 = in_RSI;
  if (in_RSI <= local_30) {
    if (in_RDX < local_30) {
      local_30 = in_RDX;
    }
    local_28 = local_30;
  }
  return local_28;
}

Assistant:

mi_decl_nodiscard long mi_option_get_clamp(mi_option_t option, long min, long max) {
  long x = mi_option_get(option);
  return (x < min ? min : (x > max ? max : x));
}